

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsVisitor.cpp
# Opt level: O1

void __thiscall OpenMD::ZConsVisitor::ZConsVisitor(ZConsVisitor *this,SimInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  Globals *pGVar4;
  pointer ppZVar5;
  pointer ppZVar6;
  pointer pcVar7;
  bool bVar8;
  Molecule *pMVar9;
  Atom *pAVar10;
  _Rb_tree_node_base *p_Var11;
  pair<int,_OpenMD::ZConsVisitor::ZConsState> *ppVar12;
  ZConsReader *this_00;
  pair<int,_OpenMD::ZConsVisitor::ZConsState> pVar13;
  ulong uVar14;
  uint uVar15;
  pointer ppAVar16;
  vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> stamp;
  pair<int,_OpenMD::ZConsVisitor::ZConsState> local_c0;
  pair<int,_OpenMD::ZConsVisitor::ZConsState> local_b8;
  long local_b0;
  pair<int,_OpenMD::ZConsVisitor::ZConsState> pStack_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  SimInfo *local_90;
  vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> local_88;
  string local_70;
  string local_50;
  
  paVar1 = &(this->super_BaseVisitor).visitorName.field_2;
  (this->super_BaseVisitor).visitorName._M_dataplus._M_p = (pointer)paVar1;
  (this->super_BaseVisitor).visitorName._M_string_length = 0;
  (this->super_BaseVisitor).visitorName.field_2._M_local_buf[0] = '\0';
  (this->super_BaseVisitor)._vptr_BaseVisitor = (_func_int **)&PTR__ZConsVisitor_002bf650;
  (this->zconsPos).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->zconsPos).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->zconsPos).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var2 = &(this->zmolStates_)._M_t._M_impl.super__Rb_tree_header;
  (this->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98 = &(this->zconsFilename_).field_2;
  (this->zconsFilename_)._M_dataplus._M_p = (pointer)local_98;
  (this->zconsFilename_)._M_string_length = 0;
  (this->zconsFilename_).field_2._M_local_buf[0] = '\0';
  this->zconsReader_ = (ZConsReader *)0x0;
  this->info_ = info;
  p_Var3 = &(this->zatomToZmol_)._M_t._M_impl.super__Rb_tree_header;
  (this->zatomToZmol_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->zatomToZmol_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->zatomToZmol_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->zatomToZmol_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->zatomToZmol_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_BaseVisitor).visitorName,0,
             (char *)(this->super_BaseVisitor).visitorName._M_string_length,0x268556);
  this->currSnapshot_ = this->info_->sman_->currentSnapshot_;
  pGVar4 = this->info_->simParams_;
  if ((pGVar4->ZconsTime).super_ParameterBase.empty_ == false) {
    this->zconsTime_ = (pGVar4->ZconsTime).data_;
  }
  else {
    memcpy(&painCave,"ZConstraint error: If you use a ZConstraint,\n\tyou must set zconsTime.\n",
           0x47);
    painCave.isFatal = 1;
    simError();
  }
  if ((pGVar4->ZconsTol).super_ParameterBase.empty_ == false) {
    this->zconsTol_ = (pGVar4->ZconsTol).data_;
  }
  else {
    this->zconsTol_ = 0.01;
    snprintf(painCave.errMsg,2000,
             "ZConstraint Warning: Tolerance for z-constraint method is not specified.\n\tOpenMD will use a default value of %f.\n\tTo set the tolerance, use the zconsTol variable.\n"
             ,0x47ae147b);
    painCave.isFatal = 0;
    simError();
  }
  ppZVar5 = (pGVar4->zconstraints_).
            super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppZVar6 = (pGVar4->zconstraints_).
            super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_90 = info;
  std::vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::vector
            (&local_88,&pGVar4->zconstraints_);
  uVar15 = (uint)((ulong)((long)ppZVar5 - (long)ppZVar6) >> 3);
  local_a0 = paVar1;
  if (0 < (int)uVar15) {
    uVar14 = 0;
    do {
      local_c0 = (pair<int,_OpenMD::ZConsVisitor::ZConsState>)
                 ((ulong)*(uint *)&(local_88.
                                    super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar14]->MolIndex).
                                   super_ParameterBase.field_0x2c | 0x100000000);
      std::
      _Rb_tree<int,std::pair<int_const,OpenMD::ZConsVisitor::ZConsState>,std::_Select1st<std::pair<int_const,OpenMD::ZConsVisitor::ZConsState>>,std::less<int>,std::allocator<std::pair<int_const,OpenMD::ZConsVisitor::ZConsState>>>
      ::_M_emplace_unique<std::pair<int,OpenMD::ZConsVisitor::ZConsState>>
                ((_Rb_tree<int,std::pair<int_const,OpenMD::ZConsVisitor::ZConsState>,std::_Select1st<std::pair<int_const,OpenMD::ZConsVisitor::ZConsState>>,std::less<int>,std::allocator<std::pair<int_const,OpenMD::ZConsVisitor::ZConsState>>>
                  *)&this->zmolStates_,&local_c0);
      uVar14 = uVar14 + 1;
    } while ((uVar15 & 0x7fffffff) != uVar14);
  }
  p_Var11 = (this->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var11 != p_Var2) {
    do {
      pMVar9 = SimInfo::getMoleculeByGlobalIndex(this->info_,p_Var11[1]._M_color);
      ppAVar16 = (pMVar9->atoms_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (ppAVar16 ==
          (pMVar9->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pAVar10 = (Atom *)0x0;
      }
      else {
        pAVar10 = *ppAVar16;
      }
      while (pAVar10 != (Atom *)0x0) {
        ppAVar16 = ppAVar16 + 1;
        local_c0.second = pMVar9->globalIndex_;
        local_c0.first = (pAVar10->super_StuntDouble).globalIndex_;
        std::
        _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
        ::_M_emplace_unique<std::pair<int,int>>
                  ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                    *)&this->zatomToZmol_,(pair<int,_int> *)&local_c0);
        if (ppAVar16 ==
            (pMVar9->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pAVar10 = (Atom *)0x0;
        }
        else {
          pAVar10 = *ppAVar16;
        }
      }
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var2);
  }
  pcVar7 = (this->info_->finalConfigFileName_)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar7,
             pcVar7 + (this->info_->finalConfigFileName_)._M_string_length);
  getPrefix(&local_50,&local_70);
  ppVar12 = (pair<int,_OpenMD::ZConsVisitor::ZConsState> *)
            std::__cxx11::string::append((char *)&local_50);
  pVar13 = (pair<int,_OpenMD::ZConsVisitor::ZConsState>)(ppVar12 + 2);
  if (*ppVar12 == pVar13) {
    local_b0 = *(long *)pVar13;
    pStack_a8 = ppVar12[3];
    local_c0 = (pair<int,_OpenMD::ZConsVisitor::ZConsState>)&local_b0;
  }
  else {
    local_b0 = *(long *)pVar13;
    local_c0 = *ppVar12;
  }
  local_b8 = ppVar12[1];
  *ppVar12 = pVar13;
  ppVar12[1].first = 0;
  ppVar12[1].second = zsFixed;
  *(undefined1 *)&ppVar12[2].first = 0;
  std::__cxx11::string::operator=((string *)&this->zconsFilename_,(string *)&local_c0);
  if (local_c0 != (pair<int,_OpenMD::ZConsVisitor::ZConsState>)&local_b0) {
    operator_delete((void *)local_c0,local_b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  this_00 = (ZConsReader *)operator_new(0x248);
  ZConsReader::ZConsReader(this_00,local_90);
  this->zconsReader_ = this_00;
  bVar8 = ZConsReader::hasNextFrame(this_00);
  if (bVar8) {
    ZConsReader::readNextFrame(this->zconsReader_);
  }
  if (local_88.super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

ZConsVisitor::ZConsVisitor(SimInfo* info) :
      BaseVisitor(), zconsReader_(NULL), info_(info) {
    visitorName       = "ZConsVisitor";
    currSnapshot_     = info_->getSnapshotManager()->getCurrentSnapshot();
    Globals* simParam = info_->getSimParams();

    if (simParam->haveZconsTime()) {
      zconsTime_ = simParam->getZconsTime();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ZConstraint error: If you use a ZConstraint,\n"
               "\tyou must set zconsTime.\n");
      painCave.isFatal = 1;
      simError();
    }

    if (simParam->haveZconsTol()) {
      zconsTol_ = simParam->getZconsTol();
    } else {
      zconsTol_ = 0.01;
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ZConstraint Warning: Tolerance for z-constraint method is not "
               "specified.\n"
               "\tOpenMD will use a default value of %f.\n"
               "\tTo set the tolerance, use the zconsTol variable.\n",
               zconsTol_);
      painCave.isFatal = 0;
      simError();
    }

    int nZconstraints              = simParam->getNZconsStamps();
    std::vector<ZConsStamp*> stamp = simParam->getZconsStamps();
    for (int i = 0; i < nZconstraints; i++) {
      int zmolIndex = stamp[i]->getMolIndex();
      zmolStates_.insert(std::make_pair(zmolIndex, zsMoving));
    }

    // fill zatomToZmol_ array
    /** @todo only works for single version now*/
    std::map<int, ZConsState>::iterator j;
    for (j = zmolStates_.begin(); j != zmolStates_.end(); ++j) {
      Molecule* mol = info_->getMoleculeByGlobalIndex(j->first);
      assert(mol != NULL);
      Molecule::AtomIterator ai;
      Atom* at;
      for (at = mol->beginAtom(ai); at != NULL; at = mol->nextAtom(ai)) {
        zatomToZmol_.insert(
            std::make_pair(at->getGlobalIndex(), mol->getGlobalIndex()));
      }
    }

    zconsFilename_ = getPrefix(info_->getFinalConfigFileName()) + ".fz";

    zconsReader_ = new ZConsReader(info);

    if (zconsReader_->hasNextFrame()) zconsReader_->readNextFrame();
  }